

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

void ngx_sort(void *base,size_t n,size_t size,_func_ngx_int_t_void_ptr_void_ptr *cmp)

{
  bool bVar1;
  void *__ptr;
  ngx_int_t nVar2;
  u_char *p;
  u_char *p2;
  u_char *p1;
  _func_ngx_int_t_void_ptr_void_ptr *cmp_local;
  size_t size_local;
  size_t n_local;
  void *base_local;
  
  __ptr = ngx_alloc(size,ngx_cycle->log);
  if (__ptr != (void *)0x0) {
    for (p2 = (u_char *)((long)base + size); p2 < (u_char *)((long)base + n * size); p2 = p2 + size)
    {
      memcpy(__ptr,p2,size);
      p = p2;
      while( true ) {
        bVar1 = false;
        if (base < p) {
          nVar2 = (*cmp)(p + -size,__ptr);
          bVar1 = 0 < nVar2;
        }
        if (!bVar1) break;
        memcpy(p,p + -size,size);
        p = p + -size;
      }
      memcpy(p,__ptr,size);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void
ngx_sort(void *base, size_t n, size_t size,
    ngx_int_t (*cmp)(const void *, const void *))
{
    u_char  *p1, *p2, *p;

    p = ngx_alloc(size, ngx_cycle->log);
    if (p == NULL) {
        return;
    }

    for (p1 = (u_char *) base + size;
         p1 < (u_char *) base + n * size;
         p1 += size)
    {
        ngx_memcpy(p, p1, size);

        for (p2 = p1;
             p2 > (u_char *) base && cmp(p2 - size, p) > 0;
             p2 -= size)
        {
            ngx_memcpy(p2, p2 - size, size);
        }

        ngx_memcpy(p2, p, size);
    }

    ngx_free(p);
}